

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O1

int ply_get_argument_property
              (p_ply_argument argument,p_ply_property *property,long *length,long *value_index)

{
  if (argument != (p_ply_argument)0x0) {
    if (property != (p_ply_property *)0x0) {
      *property = argument->property;
    }
    if (length != (long *)0x0) {
      *length = argument->length;
    }
    if (value_index != (long *)0x0) {
      *value_index = argument->value_index;
    }
    return 1;
  }
  __assert_fail("argument",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/rply/rply.c"
                ,0x316,
                "int ply_get_argument_property(p_ply_argument, p_ply_property *, long *, long *)");
}

Assistant:

int ply_get_argument_property(p_ply_argument argument,
        p_ply_property *property, long *length, long *value_index) {
    assert(argument);
    if (!argument) return 0;
    if (property) *property = argument->property;
    if (length) *length = argument->length;
    if (value_index) *value_index = argument->value_index;
    return 1;
}